

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O0

void vkt::pipeline::anon_unknown_0::addSimpleVertexAndFragmentPrograms
               (SourceCollections *programCollection,CaseDef *caseDef)

{
  bool bVar1;
  bool isUint_00;
  uint uVar2;
  TextureFormat TVar3;
  char *pcVar4;
  ostream *poVar5;
  ProgramSources *pPVar6;
  undefined1 in_R8B;
  char *local_548;
  char *local_540;
  string local_428;
  ShaderSource local_408;
  allocator<char> local_3d9;
  string local_3d8;
  ostringstream local_3b8 [8];
  ostringstream src_1;
  undefined1 local_240 [8];
  string colorFormat;
  ShaderSource local_200;
  allocator<char> local_1d1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream src;
  ChannelOrder CStack_24;
  bool isSint;
  bool isUint;
  int numComponents;
  CaseDef *caseDef_local;
  SourceCollections *programCollection_local;
  
  TVar3 = ::vk::mapVkFormat(caseDef->colorFormat);
  CStack_24 = TVar3.order;
  uVar2 = tcu::getNumUsedChannels(CStack_24);
  bVar1 = ::vk::isUintFormat(caseDef->colorFormat);
  isUint_00 = ::vk::isIntFormat(caseDef->colorFormat);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar5 = std::operator<<((ostream *)local_1a0,pcVar4);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"layout(location = 0) in  vec4 in_position;\n");
  poVar5 = std::operator<<(poVar5,"layout(location = 1) in  vec4 in_color;\n");
  poVar5 = std::operator<<(poVar5,"layout(location = 0) out vec4 o_color;\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"out gl_PerVertex {\n");
  poVar5 = std::operator<<(poVar5,"    vec4 gl_Position;\n");
  poVar5 = std::operator<<(poVar5,"};\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"void main(void)\n");
  poVar5 = std::operator<<(poVar5,"{\n");
  poVar5 = std::operator<<(poVar5,"    gl_Position = in_position;\n");
  poVar5 = std::operator<<(poVar5,"    o_color     = in_color;\n");
  std::operator<<(poVar5,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"vert",&local_1d1);
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1d0);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource
            ((VertexSource *)&local_200,(string *)((long)&colorFormat.field_2 + 8));
  glu::ProgramSources::operator<<(pPVar6,&local_200);
  glu::VertexSource::~VertexSource((VertexSource *)&local_200);
  std::__cxx11::string::~string((string *)(colorFormat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  pipeline::(anonymous_namespace)::getColorFormatStr_abi_cxx11_
            ((string *)local_240,(_anonymous_namespace_ *)(ulong)uVar2,(uint)bVar1,isUint_00,
             (bool)in_R8B);
  std::__cxx11::ostringstream::ostringstream(local_3b8);
  pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar5 = std::operator<<((ostream *)local_3b8,pcVar4);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"layout(location = 0) in  vec4 in_color;\n");
  poVar5 = std::operator<<(poVar5,"layout(location = 0) out ");
  poVar5 = std::operator<<(poVar5,(string *)local_240);
  poVar5 = std::operator<<(poVar5," o_color;\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"void main(void)\n");
  poVar5 = std::operator<<(poVar5,"{\n");
  poVar5 = std::operator<<(poVar5,"    o_color = ");
  poVar5 = std::operator<<(poVar5,(string *)local_240);
  poVar5 = std::operator<<(poVar5,"(");
  if (uVar2 == 1) {
    local_540 = "in_color.r";
  }
  else {
    if (uVar2 == 2) {
      local_548 = "in_color.rg";
    }
    else {
      local_548 = "in_color";
      if (uVar2 == 3) {
        local_548 = "in_color.rgb";
      }
    }
    local_540 = local_548;
  }
  poVar5 = std::operator<<(poVar5,local_540);
  poVar5 = std::operator<<(poVar5,");\n");
  std::operator<<(poVar5,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"frag",&local_3d9);
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_3d8);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_408,&local_428);
  glu::ProgramSources::operator<<(pPVar6,&local_408);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::__cxx11::ostringstream::~ostringstream(local_3b8);
  std::__cxx11::string::~string((string *)local_240);
  return;
}

Assistant:

void addSimpleVertexAndFragmentPrograms (SourceCollections& programCollection, const CaseDef caseDef)
{
	const int	numComponents	= tcu::getNumUsedChannels(mapVkFormat(caseDef.colorFormat).order);
	const bool	isUint			= isUintFormat(caseDef.colorFormat);
	const bool	isSint			= isIntFormat(caseDef.colorFormat);

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_position;\n"
			<< "layout(location = 1) in  vec4 in_color;\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "    vec4 gl_Position;\n"
			<< "};\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    gl_Position = in_position;\n"
			<< "    o_color     = in_color;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		const std::string colorFormat = getColorFormatStr(numComponents, isUint, isSint);

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color;\n"
			<< "layout(location = 0) out " << colorFormat << " o_color;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    o_color = " << colorFormat << "("		// float color will be converted to int/uint here if needed
			<< (numComponents == 1 ? "in_color.r"   :
				numComponents == 2 ? "in_color.rg"  :
				numComponents == 3 ? "in_color.rgb" : "in_color") << ");\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}